

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem>::
emplace_back<slang::ast::RandSeqProductionSymbol::ProdItem_const&>
          (SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem> *this,ProdItem *args)

{
  undefined8 *puVar1;
  ulong uVar2;
  pointer p;
  RandSeqProductionSymbol *pRVar3;
  size_t sVar4;
  undefined8 uVar5;
  ProdBase PVar6;
  undefined4 uVar7;
  pointer pPVar8;
  pointer pPVar9;
  pointer pPVar10;
  long lVar11;
  long lVar12;
  pointer __src;
  size_type sVar13;
  ulong uVar14;
  
  __src = this->data_ + this->len;
  if (this->len != this->cap) {
    PVar6.kind = (args->super_ProdBase).kind;
    uVar7 = *(undefined4 *)&args->field_0x4;
    pRVar3 = args->target;
    sVar4 = (args->args)._M_extent._M_extent_value;
    (__src->args)._M_ptr = (args->args)._M_ptr;
    (__src->args)._M_extent._M_extent_value = sVar4;
    __src->super_ProdBase = (ProdBase)PVar6.kind;
    *(undefined4 *)&__src->field_0x4 = uVar7;
    __src->target = pRVar3;
    sVar13 = this->len;
    this->len = sVar13 + 1;
    return this->data_ + sVar13;
  }
  if (this->len == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar14 = this->len + 1;
  uVar2 = this->cap;
  if (uVar14 < uVar2 * 2) {
    uVar14 = uVar2 * 2;
  }
  if (0x3ffffffffffffff - uVar2 < uVar2) {
    uVar14 = 0x3ffffffffffffff;
  }
  lVar12 = (long)__src - (long)this->data_;
  pPVar8 = (pointer)operator_new(uVar14 << 5);
  uVar5 = *(undefined8 *)args;
  pRVar3 = args->target;
  sVar4 = (args->args)._M_extent._M_extent_value;
  puVar1 = (undefined8 *)((long)pPVar8 + lVar12 + 0x10);
  *puVar1 = (args->args)._M_ptr;
  puVar1[1] = sVar4;
  *(undefined8 *)((long)pPVar8 + lVar12) = uVar5;
  ((undefined8 *)((long)pPVar8 + lVar12))[1] = pRVar3;
  p = this->data_;
  sVar13 = this->len;
  lVar11 = (long)p + (sVar13 * 0x20 - (long)__src);
  pPVar9 = p;
  pPVar10 = pPVar8;
  if (lVar11 == 0) {
    pPVar9 = pPVar8;
    pPVar10 = p;
    if (sVar13 != 0) {
      do {
        PVar6.kind = (pPVar10->super_ProdBase).kind;
        uVar7 = *(undefined4 *)&pPVar10->field_0x4;
        pRVar3 = pPVar10->target;
        sVar4 = (pPVar10->args)._M_extent._M_extent_value;
        (pPVar9->args)._M_ptr = (pPVar10->args)._M_ptr;
        (pPVar9->args)._M_extent._M_extent_value = sVar4;
        pPVar9->super_ProdBase = (ProdBase)PVar6.kind;
        *(undefined4 *)&pPVar9->field_0x4 = uVar7;
        pPVar9->target = pRVar3;
        pPVar10 = pPVar10 + 1;
        pPVar9 = pPVar9 + 1;
      } while (pPVar10 != __src);
    }
  }
  else {
    for (; pPVar9 != __src; pPVar9 = pPVar9 + 1) {
      PVar6.kind = (pPVar9->super_ProdBase).kind;
      uVar7 = *(undefined4 *)&pPVar9->field_0x4;
      pRVar3 = pPVar9->target;
      sVar4 = (pPVar9->args)._M_extent._M_extent_value;
      (pPVar10->args)._M_ptr = (pPVar9->args)._M_ptr;
      (pPVar10->args)._M_extent._M_extent_value = sVar4;
      pPVar10->super_ProdBase = (ProdBase)PVar6.kind;
      *(undefined4 *)&pPVar10->field_0x4 = uVar7;
      pPVar10->target = pRVar3;
      pPVar10 = pPVar10 + 1;
    }
    memcpy((void *)((long)pPVar8 + lVar12 + 0x20),__src,(lVar11 - 0x20U & 0xffffffffffffffe0) + 0x20
          );
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar13 = this->len;
  }
  this->len = sVar13 + 1;
  this->cap = uVar14;
  this->data_ = pPVar8;
  return (reference)((long)pPVar8 + lVar12);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }